

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O0

void __thiscall VCFace::VCFace(VCFace *this,int v1,int v2,int v3,VertexGroup *vg,VCCluster *c)

{
  CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *this_00;
  Scalar *s;
  MatrixBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *this_01;
  CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *this_02;
  Transpose<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> this_03;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  int *in_RDI;
  long in_R8;
  undefined8 in_R9;
  ReturnType __x;
  double dVar1;
  Vector4d plane;
  Vector3d a;
  Vector3d n;
  Vector3d v;
  Vector3d u;
  Vertex *p3;
  Vertex *p2;
  Vertex *p1;
  Vec3d *in_stack_fffffffffffffd58;
  Vec3d *in_stack_fffffffffffffd60;
  Vec3d *in_stack_fffffffffffffd68;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffd70;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffd98;
  VCFace *in_stack_fffffffffffffdb8;
  VCCluster *in_stack_fffffffffffffdc0;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffdf0;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffdf8;
  Vec3d local_158;
  Vec3d local_140;
  Vec3d local_128 [5];
  Vec3d local_b0 [2];
  Vec3d local_80 [2];
  long local_50;
  long local_48;
  long local_40;
  undefined8 local_28;
  long local_20;
  int local_14;
  int local_10;
  int local_c;
  
  *in_RDI = in_ESI;
  in_RDI[1] = in_EDX;
  in_RDI[2] = in_ECX;
  local_28 = in_R9;
  local_20 = in_R8;
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_c = in_ESI;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)0x27d327);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix((Matrix<double,_3,_3,_0,_3,_3> *)0x27d335);
  Eigen::Matrix<double,_4,_4,_0,_4,_4>::Matrix((Matrix<double,_4,_4,_0,_4,_4> *)0x27d343);
  std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>::set
            ((set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> *)0x27d359);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)0x27d36a);
  *(undefined8 *)(in_RDI + 0x50) = local_28;
  local_40 = local_20 + (long)local_c * 0x50;
  local_48 = local_20 + (long)local_10 * 0x50;
  local_50 = local_20 + (long)local_14 * 0x50;
  ::operator-(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
  VCMyvecToEigen(in_stack_fffffffffffffd58);
  Vec3d::~Vec3d(local_80);
  ::operator-(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
  VCMyvecToEigen(in_stack_fffffffffffffd58);
  Vec3d::~Vec3d(local_b0);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
            (in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
  VCMyvecToEigen(in_stack_fffffffffffffd58);
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::normalized(in_stack_fffffffffffffd98);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffd60,
             (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffd58);
  __x = Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::dot<Eigen::Matrix<double,3,1,0,3,1>>
                  (in_stack_fffffffffffffd70,
                   (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffffd68);
  dVar1 = sqrt(__x);
  *(double *)(in_RDI + 0x48) = dVar1 * 0.5;
  operator+(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
  operator+(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
  operator/(in_stack_fffffffffffffd68,&in_stack_fffffffffffffd60->x);
  VCMyvecToEigen(in_stack_fffffffffffffd58);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffd60,
             (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffd58);
  Vec3d::~Vec3d(local_128);
  Vec3d::~Vec3d(&local_140);
  Vec3d::~Vec3d(&local_158);
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::normalize
            ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffffd60);
  Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)0x27d614);
  this_00 = (CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
            Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::x
                      ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)0x27d623);
  Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator<<
            ((DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)in_stack_fffffffffffffd68,
             &in_stack_fffffffffffffd60->x);
  s = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::y
                ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)0x27d653);
  Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator_(this_00,s);
  this_01 = (MatrixBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
            Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::z
                      ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)0x27d680);
  this_02 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator_(this_00,s);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::dot<Eigen::Matrix<double,3,1,0,3,1>>
            ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)this_02,
             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffffd68);
  Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator_(this_00,s);
  Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::~CommaInitializer
            ((CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)0x27d6f5);
  this_03 = Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::transpose
                      ((DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)in_stack_fffffffffffffd58
                      );
  Eigen::MatrixBase<Eigen::Matrix<double,4,1,0,4,1>>::operator*
            (this_01,(MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_> *)this_02
            );
  Eigen::Matrix<double,4,4,0,4,4>::operator=
            ((Matrix<double,_4,_4,_0,_4,_4> *)this_03.m_matrix,
             (MatrixBase<Eigen::CoeffBasedProduct<const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_&,_const_Eigen::Transpose<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_256>_>
              *)in_stack_fffffffffffffd58);
  VCCluster::addItem(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  return;
}

Assistant:

VCFace::VCFace(int v1, int v2, int v3, VertexGroup* vg, VCCluster* c)
	:v1(v1), v2(v2), v3(v3), cluster(c)
{
	Vertex* p1 = &vg->group[v1];
	Vertex* p2 = &vg->group[v2];
	Vertex* p3 = &vg->group[v3];
	Vector3d u = VCMyvecToEigen(p2->pos - p1->pos);
	Vector3d v = VCMyvecToEigen(p3->pos - p1->pos);
	Vector3d n(u.cross(v)), a(VCMyvecToEigen(p1->pos));
	normal = n.normalized();
	area = 0.5 * sqrt(n.dot(n));
	center = VCMyvecToEigen((p1->pos + p2->pos + p3->pos) / 3);
	n.normalize();
	Vector4d plane;
	plane << n.x() , n.y() , n.z() ,-n.dot(a); 
	E = plane * plane.transpose();
	c->addItem(this);
}